

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O0

void __thiscall
kratos::EventVisitor::add_info(EventVisitor *this,shared_ptr<kratos::EventTracingStmt> *stmt)

{
  int iVar1;
  IRNodeKind IVar2;
  StatementType SVar3;
  StatementBlockType SVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *psVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *pmVar7;
  bool bVar8;
  undefined1 local_c8 [8];
  EventInfo i;
  StmtBlock *b;
  Stmt *s;
  IRNode *p;
  bool combinational;
  shared_ptr<kratos::EventTracingStmt> *stmt_local;
  EventVisitor *this_local;
  
  p._7_1_ = '\x01';
  peVar5 = std::
           __shared_ptr_access<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)stmt);
  iVar1 = (*(peVar5->super_AuxiliaryStmt).super_Stmt.super_IRNode._vptr_IRNode[4])();
  s = (Stmt *)CONCAT44(extraout_var,iVar1);
  do {
    bVar8 = false;
    if (s != (Stmt *)0x0) {
      IVar2 = IRNode::ir_node_kind(&s->super_IRNode);
      bVar8 = IVar2 == StmtKind;
    }
    if (!bVar8) goto LAB_003ebabc;
    SVar3 = Stmt::type(s);
    if (SVar3 == Block) {
      i.stmt.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)s;
      SVar4 = StmtBlock::block_type((StmtBlock *)s);
      if (SVar4 == Sequential) {
        p._7_1_ = '\0';
LAB_003ebabc:
        EventInfo::EventInfo((EventInfo *)local_c8);
        peVar5 = std::
                 __shared_ptr_access<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)stmt);
        psVar6 = EventTracingStmt::event_name_abi_cxx11_(peVar5);
        std::__cxx11::string::operator=((string *)local_c8,(string *)psVar6);
        peVar5 = std::
                 __shared_ptr_access<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)stmt);
        psVar6 = EventTracingStmt::transaction_abi_cxx11_(peVar5);
        std::__cxx11::string::operator=
                  ((string *)(i.name.field_2._M_local_buf + 8),(string *)psVar6);
        i.transaction.field_2._M_local_buf[8] = p._7_1_;
        peVar5 = std::
                 __shared_ptr_access<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)stmt);
        i._64_8_ = EventTracingStmt::action_type(peVar5);
        peVar5 = std::
                 __shared_ptr_access<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)stmt);
        pmVar7 = EventTracingStmt::event_fields_abi_cxx11_(peVar5);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
        ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                     *)&i.type,pmVar7);
        std::shared_ptr<kratos::EventTracingStmt>::operator=
                  ((shared_ptr<kratos::EventTracingStmt> *)
                   &i.fields._M_t._M_impl.super__Rb_tree_header._M_node_count,stmt);
        std::vector<kratos::EventInfo,std::allocator<kratos::EventInfo>>::
        emplace_back<kratos::EventInfo&>
                  ((vector<kratos::EventInfo,std::allocator<kratos::EventInfo>> *)&this->info,
                   (EventInfo *)local_c8);
        EventInfo::~EventInfo((EventInfo *)local_c8);
        return;
      }
    }
    iVar1 = (*(s->super_IRNode)._vptr_IRNode[4])();
    s = (Stmt *)CONCAT44(extraout_var_00,iVar1);
  } while( true );
}

Assistant:

void add_info(const std::shared_ptr<EventTracingStmt> &stmt) {
        bool combinational = true;
        auto *p = stmt->parent();

        while (p && p->ir_node_kind() == IRNodeKind::StmtKind) {
            auto *s = reinterpret_cast<Stmt *>(p);
            if (s->type() == StatementType::Block) {
                auto *b = reinterpret_cast<StmtBlock *>(s);
                if (b->block_type() == StatementBlockType::Sequential) {
                    combinational = false;
                    break;
                }
            }

            p = s->parent();
        }

        EventInfo i;
        i.name = stmt->event_name();
        i.transaction = stmt->transaction();
        i.combinational = combinational;
        i.type = stmt->action_type();
        i.fields = stmt->event_fields();
        i.stmt = stmt;

        info.emplace_back(i);
    }